

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O3

int process_copy_output(process_info_t *p,FILE *stream)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char buf [1024];
  char acStack_418 [1024];
  
  iVar1 = fseek((FILE *)p->stdout_file,0,0);
  if (iVar1 < 0) {
    __s = "fseek";
  }
  else {
    sVar2 = fread(acStack_418,1,0x400,(FILE *)p->stdout_file);
    iVar1 = (int)sVar2;
    while (iVar1 != 0) {
      print_lines(acStack_418,(long)(int)sVar2,stream);
      sVar2 = fread(acStack_418,1,0x400,(FILE *)p->stdout_file);
      iVar1 = (int)sVar2;
    }
    iVar1 = ferror((FILE *)p->stdout_file);
    if (iVar1 == 0) {
      return 0;
    }
    __s = "read";
  }
  perror(__s);
  return -1;
}

Assistant:

int process_copy_output(process_info_t* p, FILE* stream) {
  char buf[1024];
  int r;

  r = fseek(p->stdout_file, 0, SEEK_SET);
  if (r < 0) {
    perror("fseek");
    return -1;
  }

  /* TODO: what if the line is longer than buf */
  while ((r = fread(buf, 1, sizeof(buf), p->stdout_file)) != 0)
    print_lines(buf, r, stream);

  if (ferror(p->stdout_file)) {
    perror("read");
    return -1;
  }

  return 0;
}